

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,unsigned_long,fmt::v8::detail::digit_grouping<char32_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,unsigned_long significand,
          int significand_size,int integral_size,char32_t decimal_point,
          digit_grouping<char32_t> *grouping)

{
  undefined2 uVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bVar2;
  char32_t *pcVar3;
  ulong uVar4;
  unsigned_long uVar5;
  char32_t *pcVar6;
  char32_t *pcVar7;
  uint uVar8;
  uint uVar9;
  undefined1 uVar11;
  undefined1 auVar10 [16];
  format_decimal_result<char32_t_*> fVar12;
  basic_string_view<char32_t> digits;
  basic_memory_buffer<char32_t,_500UL,_std::allocator<char32_t>_> buffer;
  char32_t cStack_888;
  char32_t acStack_884 [23];
  undefined8 local_828;
  undefined1 *local_820;
  long local_818;
  long local_810;
  undefined1 local_808 [2008];
  
  if ((grouping->sep_).thousands_sep == L'\0') {
    if (decimal_point == L'\0') {
      fVar12 = format_decimal<char32_t,unsigned_long>
                         ((char32_t *)&local_828,significand,significand_size);
      pcVar3 = fVar12.end;
    }
    else {
      pcVar3 = (char32_t *)((long)&local_828 + (long)significand_size * 4 + 4);
      uVar8 = significand_size - integral_size;
      pcVar7 = pcVar3;
      if (1 < (int)uVar8) {
        uVar9 = (uVar8 >> 1) + 1;
        uVar5 = significand;
        pcVar6 = pcVar3;
        do {
          pcVar7 = pcVar6 + -2;
          significand = uVar5 / 100;
          uVar1 = *(undefined2 *)
                   (
                   "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   + (uVar5 % 100) * 2);
          uVar11 = (undefined1)((ushort)uVar1 >> 8);
          auVar10 = ZEXT416(CONCAT22((short)(CONCAT13(uVar11,CONCAT12(uVar11,uVar1)) >> 0x10),
                                     CONCAT11((char)uVar1,(char)uVar1)));
          auVar10 = pshuflw(auVar10,auVar10,0x60);
          *(ulong *)(pcVar6 + -2) = CONCAT44(auVar10._4_4_ >> 0x18,auVar10._0_4_ >> 0x18);
          uVar9 = uVar9 - 1;
          uVar5 = significand;
          pcVar6 = pcVar7;
        } while (1 < uVar9);
      }
      uVar4 = significand;
      if ((uVar8 & 1) != 0) {
        uVar4 = significand / 10;
        pcVar7[-1] = (int)significand + (int)uVar4 * -10 | 0x30;
        pcVar7 = pcVar7 + -1;
      }
      pcVar7[-1] = decimal_point;
      format_decimal<char32_t,unsigned_long>
                (pcVar7 + (-1 - (long)integral_size),uVar4,integral_size);
    }
    bVar2 = copy_str_noinline<char32_t,char32_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                      ((char32_t *)&local_828,pcVar3,out);
  }
  else {
    local_820 = local_808;
    local_818 = 0;
    local_828 = &PTR_grow_001b3970;
    local_810 = 500;
    if (decimal_point == L'\0') {
      fVar12 = format_decimal<char32_t,unsigned_long>(&cStack_888,significand,significand_size);
      pcVar3 = fVar12.end;
    }
    else {
      pcVar3 = acStack_884 + significand_size;
      uVar8 = significand_size - integral_size;
      pcVar7 = pcVar3;
      if (1 < (int)uVar8) {
        uVar9 = (uVar8 >> 1) + 1;
        uVar5 = significand;
        pcVar6 = pcVar3;
        do {
          pcVar7 = pcVar6 + -2;
          significand = uVar5 / 100;
          uVar1 = *(undefined2 *)
                   (
                   "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   + (uVar5 % 100) * 2);
          uVar11 = (undefined1)((ushort)uVar1 >> 8);
          auVar10 = ZEXT416(CONCAT22((short)(CONCAT13(uVar11,CONCAT12(uVar11,uVar1)) >> 0x10),
                                     CONCAT11((char)uVar1,(char)uVar1)));
          auVar10 = pshuflw(auVar10,auVar10,0x60);
          *(ulong *)(pcVar6 + -2) = CONCAT44(auVar10._4_4_ >> 0x18,auVar10._0_4_ >> 0x18);
          uVar9 = uVar9 - 1;
          uVar5 = significand;
          pcVar6 = pcVar7;
        } while (1 < uVar9);
      }
      uVar4 = significand;
      if ((uVar8 & 1) != 0) {
        uVar4 = significand / 10;
        pcVar7[-1] = (int)significand + (int)uVar4 * -10 | 0x30;
        pcVar7 = pcVar7 + -1;
      }
      pcVar7[-1] = decimal_point;
      format_decimal<char32_t,unsigned_long>
                (pcVar7 + (-1 - (long)integral_size),uVar4,integral_size);
    }
    copy_str_noinline<char32_t,char32_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
              (&cStack_888,pcVar3,(buffer<char32_t> *)&local_828);
    if (integral_size < 0) {
      fmt::v8::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                 ,0x195,"negative value");
    }
    digits.size_._0_4_ = integral_size;
    digits.data_ = (char32_t *)local_820;
    digits.size_._4_4_ = 0;
    digit_grouping<char32_t>::
    apply<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t>
              (grouping,out,digits);
    bVar2 = copy_str_noinline<char32_t,char32_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                      ((char32_t *)(local_820 + (ulong)(uint)integral_size * 4),
                       (char32_t *)(local_820 + local_818 * 4),out);
    if (local_820 != local_808) {
      operator_delete(local_820,local_810 << 2);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}